

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.h
# Opt level: O0

void __thiscall
lf::mesh::hybrid2d::Segment::Segment
          (Segment *this,size_type index,
          unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *geometry
          ,Point *endpoint0,Point *endpoint1)

{
  bool bVar1;
  RefElType RVar2;
  RefElType RVar3;
  int iVar4;
  runtime_error *prVar5;
  pointer pGVar6;
  string local_630;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  stringstream local_5c0 [8];
  stringstream ss_2;
  ostream local_5b0 [382];
  RefEl local_432;
  RefEl local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  stringstream local_3c0 [8];
  stringstream ss_1;
  ostream local_3b0 [376];
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  Point *local_30;
  Point *endpoint1_local;
  Point *endpoint0_local;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *geometry_local;
  Segment *pSStack_10;
  size_type index_local;
  Segment *this_local;
  
  local_30 = endpoint1;
  endpoint1_local = endpoint0;
  endpoint0_local = (Point *)geometry;
  geometry_local._4_4_ = index;
  pSStack_10 = this;
  Entity::Entity(&this->super_Entity);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR_Codim_00e98798;
  this->index_ = geometry_local._4_4_;
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::unique_ptr
            (&this->geometry_,
             (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *)
             endpoint0_local);
  (this->nodes_)._M_elems[0] = endpoint1_local;
  (this->nodes_)._M_elems[1] = local_30;
  this->this_ = &this->super_Entity;
  if ((endpoint1_local == (Point *)0x0) || (local_30 == (Point *)0x0)) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::operator<<(local_1a8,"Invalid pointer to endnode of edge");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"(endpoint0 != nullptr) && (endpoint1 != nullptr)",&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/segment.h"
               ,&local_211);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1e8,&local_210,0x40,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"this code should not be reached");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->geometry_);
  if (bVar1) {
    pGVar6 = std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
             operator->(&this->geometry_);
    iVar4 = (**pGVar6->_vptr_Geometry)();
    if (iVar4 != 1) {
      std::__cxx11::stringstream::stringstream(local_3c0);
      std::operator<<(local_3b0,"Geometry must describe a curve");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e0,"geometry_->DimLocal() == 1",&local_3e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/segment.h"
                 ,&local_409);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_3e0,&local_408,0x43,&local_430);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator(&local_409);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator(&local_3e1);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"this code should not be reached");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pGVar6 = std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
             operator->(&this->geometry_);
    iVar4 = (*pGVar6->_vptr_Geometry[2])();
    local_431.type_ = (RefElType)iVar4;
    RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_431);
    local_432 = lf::base::RefEl::kSegment();
    RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_432);
    if (RVar2 != RVar3) {
      std::__cxx11::stringstream::stringstream(local_5c0);
      std::operator<<(local_5b0,"Segment geometry must fit a segment");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e0,"geometry_->RefEl() == base::RefEl::kSegment()",&local_5e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_608,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/segment.h"
                 ,&local_609);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_5e0,&local_608,0x45,&local_630);
      std::__cxx11::string::~string((string *)&local_630);
      std::__cxx11::string::~string((string *)&local_608);
      std::allocator<char>::~allocator(&local_609);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::allocator<char>::~allocator(&local_5e1);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"this code should not be reached");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

explicit Segment(size_type index,
                   std::unique_ptr<geometry::Geometry>&& geometry,
                   const Point* endpoint0, const Point* endpoint1)
      : index_(index),
        geometry_(std::move(geometry)),
        nodes_({endpoint0, endpoint1}),
        this_(this) {
    LF_VERIFY_MSG((endpoint0 != nullptr) && (endpoint1 != nullptr),
                  "Invalid pointer to endnode of edge");
    if (geometry_) {
      LF_VERIFY_MSG(geometry_->DimLocal() == 1,
                    "Geometry must describe a curve");
      LF_VERIFY_MSG(geometry_->RefEl() == base::RefEl::kSegment(),
                    "Segment geometry must fit a segment");
    }
  }